

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O0

void __thiscall vectorgraphics::TikzPlotter::addPolygon(TikzPlotter *this,Polygon2D *polygon_2d)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  *this_00;
  element_type *peVar2;
  ostream *poVar3;
  vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
  *this_01;
  __shared_ptr_access<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *point_2d;
  vector<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
  *this_03;
  __shared_ptr_access<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_04;
  element_type *line_segment_2d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  bool local_2c9;
  shared_ptr<vectorgraphics::LineSegment2D> *line_segment_ptr;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
  *__range1_1;
  shared_ptr<vectorgraphics::Point2D> *point_ptr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
  *__range2;
  allocator<char> local_258;
  allocator<char> local_257;
  allocator<char> local_256;
  allocator<char> local_255;
  allocator<char> local_254;
  allocator<char> local_253;
  allocator<char> local_252;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  iterator local_148;
  size_type local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string local_120;
  _Self local_100;
  byte local_f3;
  byte local_f2;
  allocator<char> local_f1;
  key_type local_f0;
  _Self local_d0;
  _Self local_c8;
  allocator<char> local_b9;
  key_type local_b8;
  _Self local_98 [3];
  vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  local_80;
  __shared_ptr_access<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_68;
  shared_ptr<vectorgraphics::Style> *style_ptr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  *__range1;
  StyleMap style_map;
  Polygon2D *polygon_2d_local;
  TikzPlotter *this_local;
  
  style_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)polygon_2d;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&__range1);
  this_00 = (vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
             *)(style_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18);
  __end1 = std::
           vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
           ::begin(this_00);
  style_ptr = (shared_ptr<vectorgraphics::Style> *)
              std::
              vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
              ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<vectorgraphics::Style>_*,_std::vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>_>
                                     *)&style_ptr), bVar1) {
    local_68 = (__shared_ptr_access<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<vectorgraphics::Style>_*,_std::vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>_>
                  ::operator*(&__end1);
    peVar2 = std::
             __shared_ptr_access<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_68);
    std::
    vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
    ::vector(&local_80,
             (vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
              *)style_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = Style::conditionFulfilled(peVar2,&local_80);
    std::
    vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
    ::~vector(&local_80);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_68);
      Style::applyStyle(peVar2,(StyleMap *)&__range1);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<vectorgraphics::Style>_*,_std::vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  local_f2 = 0;
  local_f3 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"draw",&local_b9);
  local_98[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&__range1,&local_b8);
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__range1);
  bVar1 = std::operator!=(local_98,&local_c8);
  local_2c9 = true;
  if (!bVar1) {
    std::allocator<char>::allocator();
    local_f2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"fill",&local_f1);
    local_f3 = 1;
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__range1,&local_f0);
    local_100._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&__range1);
    local_2c9 = std::operator!=(&local_d0,&local_100);
  }
  if ((local_f3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_f0);
  }
  if ((local_f2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_f1);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  if (local_2c9 != false) {
    poVar3 = std::operator<<((ostream *)&this->field_0x10,"\\path[");
    __range2._7_1_ = 1;
    local_250 = &local_248;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"draw",&local_251);
    local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_228,"draw opacity",&local_252);
    local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_208,"fill",&local_253);
    local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1e8,"fill opacity",&local_254);
    local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1c8,"line width",&local_255);
    local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1a8,"line cap",&local_256);
    local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_188,"dash pattern",&local_257);
    local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_168,"*polygon_path",&local_258);
    __range2._7_1_ = 0;
    local_148 = &local_248;
    local_140 = 8;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&__range2 + 6));
    __l._M_len = local_140;
    __l._M_array = local_148;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_138,__l,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range2 + 6));
    getStyleMapString(&local_120,(StyleMap *)&__range1,&local_138);
    poVar3 = std::operator<<(poVar3,(string *)&local_120);
    std::operator<<(poVar3,"] ");
    std::__cxx11::string::~string((string *)&local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&__range2 + 6));
    local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148;
    do {
      local_388 = local_388 + -1;
      std::__cxx11::string::~string((string *)local_388);
    } while (local_388 != &local_248);
    std::allocator<char>::~allocator(&local_258);
    std::allocator<char>::~allocator(&local_257);
    std::allocator<char>::~allocator(&local_256);
    std::allocator<char>::~allocator(&local_255);
    std::allocator<char>::~allocator(&local_254);
    std::allocator<char>::~allocator(&local_253);
    std::allocator<char>::~allocator(&local_252);
    std::allocator<char>::~allocator(&local_251);
    this_01 = (vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
               *)(style_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x60);
    __end2 = std::
             vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
             ::begin(this_01);
    point_ptr = (shared_ptr<vectorgraphics::Point2D> *)
                std::
                vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
                ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::shared_ptr<vectorgraphics::Point2D>_*,_std::vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>_>
                                       *)&point_ptr), bVar1) {
      this_02 = (__shared_ptr_access<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<const_std::shared_ptr<vectorgraphics::Point2D>_*,_std::vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>_>
                   ::operator*(&__end2);
      point_2d = std::
                 __shared_ptr_access<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(this_02);
      poVar3 = operator<<((ostream *)&this->field_0x10,point_2d);
      std::operator<<(poVar3,"-- ");
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<vectorgraphics::Point2D>_*,_std::vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>_>
      ::operator++(&__end2);
    }
    poVar3 = std::operator<<((ostream *)&this->field_0x10,"cycle;");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  this_03 = (vector<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
             *)(style_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x48);
  __end1_1 = std::
             vector<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
             ::begin(this_03);
  line_segment_ptr =
       (shared_ptr<vectorgraphics::LineSegment2D> *)
       std::
       vector<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
       ::end(this_03);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::shared_ptr<vectorgraphics::LineSegment2D>_*,_std::vector<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>_>
                             *)&line_segment_ptr), bVar1) {
    this_04 = (__shared_ptr_access<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<vectorgraphics::LineSegment2D>_*,_std::vector<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>_>
                 ::operator*(&__end1_1);
    line_segment_2d =
         std::
         __shared_ptr_access<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*(this_04);
    addLineSegment(this,line_segment_2d);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<vectorgraphics::LineSegment2D>_*,_std::vector<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&__range1);
  return;
}

Assistant:

void TikzPlotter::addPolygon(const Polygon2D &polygon_2d) {
    // first add the polygon
    StyleMap style_map;

    // check which styles apply
    for(const auto& style_ptr : polygon_2d.style_ptrs) {
      if(style_ptr->conditionFulfilled(polygon_2d.flag_ptrs)) {
        style_ptr->applyStyle(style_map);
      }
    }

    // add the polygon based on style_map final state
    if(style_map.find("draw") != style_map.end() || style_map.find("fill") != style_map.end()) {
      content << R"(\path[)" 
        << getStyleMapString(style_map, {"draw", "draw opacity", "fill", "fill opacity", "line width", "line cap", "dash pattern", "*polygon_path"})
        << "] ";
      
      for(const auto& point_ptr : polygon_2d.point_ptrs_) 
        content << *point_ptr << "-- ";

      content << "cycle;"
        << std::endl;
    }

    // and then the outline
      for(const auto& line_segment_ptr : polygon_2d.line_segment_ptrs_)
        addLineSegment(*line_segment_ptr);
  }